

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O2

attack_result *
make_ranged_throw(attack_result *__return_storage_ptr__,player *p,object *obj,loc grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  char *buf;
  monster_conflict *mon;
  wchar_t s;
  wchar_t b;
  uint32_t *local_38;
  
  buf = (char *)mem_alloc(0x14);
  __return_storage_ptr__->success = false;
  __return_storage_ptr__->dmg = L'\0';
  __return_storage_ptr__->msg_type = 0;
  __return_storage_ptr__->hit_verb = buf;
  mon = (monster_conflict *)square_monster(cave,grid);
  b = L'\0';
  s = L'\0';
  my_strcpy(buf,"hits",0x14);
  wVar2 = chance_of_missile_hit(p,obj,(object *)0x0,mon);
  _Var1 = test_hit(wVar2,mon->race->ac);
  if (_Var1) {
    local_38 = &__return_storage_ptr__->msg_type;
    __return_storage_ptr__->success = true;
    improve_attack_modifier(p,obj,mon,&b,&s,buf,true);
    if ((p->opts).opt[0x2c] == false) {
      wVar2 = ranged_damage(p,mon,obj,(object *)0x0,b,s);
      wVar2 = critical_shot(p,mon,(int)obj->weight,(int)obj->to_h,wVar2,false,local_38);
    }
    else {
      wVar2 = o_ranged_damage(p,mon,obj,(object *)0x0,b,s,local_38);
    }
    __return_storage_ptr__->dmg = wVar2;
    _Var1 = flag_has_dbg(obj->flags,5,0x23,"obj->flags","OF_EXPLODE");
    if (_Var1) {
      __return_storage_ptr__->dmg = wVar2 * 3;
    }
    learn_brand_slay_from_throw(p,obj,mon);
  }
  return __return_storage_ptr__;
}

Assistant:

struct attack_result make_ranged_throw(struct player *p,
	struct object *obj, struct loc grid)
{
	char *hit_verb = mem_alloc(20 * sizeof(char));
	struct attack_result result = {false, 0, 0, hit_verb};
	struct monster *mon = square_monster(cave, grid);
	int b = 0, s = 0;

	my_strcpy(hit_verb, "hits", 20);

	/* If we missed then we're done */
	if (!test_hit(chance_of_missile_hit(p, obj, NULL, mon), mon->race->ac))
		return result;

	result.success = true;

	improve_attack_modifier(p, obj, mon, &b, &s, result.hit_verb, true);

	if (!OPT(p, birth_percent_damage)) {
		result.dmg = ranged_damage(p, mon, obj, NULL, b, s);
		result.dmg = critical_shot(p, mon, obj->weight, obj->to_h,
			result.dmg, false, &result.msg_type);
	} else {
		result.dmg = o_ranged_damage(p, mon, obj, NULL, b, s, &result.msg_type);
	}

	/* Direct adjustment for exploding things (flasks of oil) */
	if (of_has(obj->flags, OF_EXPLODE))
		result.dmg *= 3;

	learn_brand_slay_from_throw(p, obj, mon);

	return result;
}